

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O1

void quicly_sendbuf_emit(quicly_stream_t *stream,quicly_sendbuf_t *sb,size_t off,void *dst,
                        size_t *len,int *wrote_all)

{
  quicly_sendbuf_vec_t *pqVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  
  sVar10 = *len;
  if (sVar10 == 0) {
    uVar9 = 0;
    sVar10 = 0;
  }
  else {
    lVar8 = 0;
    uVar9 = 0;
    uVar6 = off + sb->off_in_first_vec;
    do {
      if ((sb->vecs).size <= uVar9) goto LAB_00130550;
      pqVar1 = (sb->vecs).entries;
      uVar5 = *(ulong *)((long)&pqVar1->len + lVar8);
      uVar4 = uVar6 - uVar5;
      if (uVar6 < uVar5) {
        puVar7 = (undefined8 *)((long)&pqVar1->cb + lVar8);
        uVar5 = uVar5 - uVar6;
        uVar4 = uVar5;
        if (sVar10 < uVar5) {
          uVar4 = sVar10;
        }
        iVar3 = (**(code **)*puVar7)(puVar7,dst,uVar6,uVar4);
        if (iVar3 == 0) {
          bVar11 = sVar10 < uVar5;
          dst = (void *)((long)dst + uVar4);
          sVar10 = sVar10 - uVar4;
          cVar2 = bVar11 * '\x02';
          uVar4 = 0;
        }
        else {
          convert_error(stream,iVar3);
          cVar2 = '\x01';
          uVar4 = uVar6;
        }
      }
      else {
        cVar2 = '\0';
      }
      if (cVar2 != '\0') {
        if (cVar2 != '\x02') {
          return;
        }
        goto LAB_00130550;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
      uVar6 = uVar4;
    } while (sVar10 != 0);
    sVar10 = 0;
  }
LAB_00130550:
  if ((sVar10 != 0) || (iVar3 = 0, (sb->vecs).size <= uVar9)) {
    *len = *len - sVar10;
    iVar3 = 1;
  }
  *wrote_all = iVar3;
  return;
}

Assistant:

void quicly_sendbuf_emit(quicly_stream_t *stream, quicly_sendbuf_t *sb, size_t off, void *dst, size_t *len, int *wrote_all)
{
    size_t vec_index, capacity = *len;
    int ret;

    off += sb->off_in_first_vec;
    for (vec_index = 0; capacity != 0 && vec_index < sb->vecs.size; ++vec_index) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + vec_index;
        if (off < vec->len) {
            size_t bytes_flatten = vec->len - off;
            int partial = 0;
            if (capacity < bytes_flatten) {
                bytes_flatten = capacity;
                partial = 1;
            }
            if ((ret = vec->cb->flatten_vec(vec, dst, off, bytes_flatten)) != 0) {
                convert_error(stream, ret);
                return;
            }
            dst = (uint8_t *)dst + bytes_flatten;
            capacity -= bytes_flatten;
            off = 0;
            if (partial)
                break;
        } else {
            off -= vec->len;
        }
    }

    if (capacity == 0 && vec_index < sb->vecs.size) {
        *wrote_all = 0;
    } else {
        *len = *len - capacity;
        *wrote_all = 1;
    }
}